

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O0

void __thiscall KDReports::Test::testSimpleScaleTo(Test *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AutoTableElement *pAVar5;
  QList<QRect> *t2;
  reference pQVar6;
  QRect local_1f8;
  QList<QRect> local_1e8;
  QRect local_1d0;
  QList<QRect> local_1c0;
  QRect local_1a8;
  QList<QRect> local_198;
  QRect local_180;
  QList<QRect> local_170;
  double local_158;
  double local_150;
  QRect local_148;
  QList<QRect> local_138;
  QList<QRect> local_120;
  double local_108;
  double local_100;
  undefined4 local_f4;
  AutoTableElement local_f0 [32];
  QLatin1String local_d0;
  QString local_c0;
  QFont local_a8 [16];
  Report local_98 [8];
  Report report;
  QLatin1Char local_7f;
  QChar local_7e [7];
  QString local_70;
  QString local_58;
  QString local_40;
  QByteArray local_28;
  Test *local_10;
  Test *this_local;
  
  local_10 = this;
  if (fontFound) {
    fillModel(this,4,8,false);
    KDReports::Report::Report(local_98,(QObject *)0x0);
    KDReports::Report::setReportMode((ReportMode)local_98);
    QLatin1String::QLatin1String(&local_d0,"Noto Sans");
    QString::QString(&local_c0,local_d0);
    QFont::QFont(local_a8,&local_c0,0xe,-1,false);
    KDReports::Report::setDefaultFont((QFont *)local_98);
    QFont::~QFont(local_a8);
    QString::~QString(&local_c0);
    pAVar5 = (AutoTableElement *)KDReports::Report::mainTable();
    KDReports::AutoTableElement::AutoTableElement(local_f0,(QAbstractItemModel *)&this->m_model);
    KDReports::MainTable::setAutoTableElement(pAVar5);
    KDReports::AutoTableElement::~AutoTableElement(local_f0);
    KDReports::Report::scaleTo((int)local_98,1);
    iVar3 = KDReports::Report::numberOfPages();
    bVar1 = QTest::qCompare(iVar3,1,"report.numberOfPages()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                            ,0xcc);
    if ((bVar1 & 1) == 0) {
      local_f4 = 1;
    }
    else {
      KDReports::Report::mainTable();
      local_100 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
      local_108 = 1.0;
      bVar1 = QTest::qCompare(&local_100,&local_108,
                              "report.mainTable()->lastAutoFontScalingFactor()","1.0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                              ,0xcd);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        local_138.d.d = (Data *)0x0;
        local_138.d.ptr = (QRect *)0x0;
        local_138.d.size = 0;
        QList<QRect>::QList(&local_138);
        QRect::QRect(&local_148,0,0,4,8);
        t2 = QList<QRect>::operator<<(&local_138,&local_148);
        bVar2 = QTest::qCompare<QRect>
                          (&local_120,t2,"report.mainTable()->pageRects()",
                           "QList<QRect>() << QRect(0, 0, 4, 8)",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0xce);
        QList<QRect>::~QList(&local_138);
        QList<QRect>::~QList(&local_120);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          KDReports::Report::scaleTo((int)local_98,4);
          iVar3 = KDReports::Report::numberOfPages();
          bVar1 = QTest::qCompare(iVar3,4,"report.numberOfPages()","4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                  ,0xd0);
          if ((bVar1 & 1) == 0) {
            local_f4 = 1;
          }
          else {
            KDReports::Report::mainTable();
            local_150 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
            local_158 = 1.0;
            bVar1 = QTest::qCompare(&local_150,&local_158,
                                    "report.mainTable()->lastAutoFontScalingFactor()","1.0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                    ,0xd1);
            if (((bVar1 ^ 0xff) & 1) == 0) {
              KDReports::Report::mainTable();
              KDReports::MainTable::pageRects();
              pQVar6 = QList<QRect>::operator[](&local_170,0);
              QRect::QRect(&local_180,0,0,1,8);
              bVar2 = QTest::qCompare<QRect,QRect>
                                (pQVar6,&local_180,"report.mainTable()->pageRects()[0]",
                                 "QRect(0, 0, 1, 8)",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                 ,0xd2);
              QList<QRect>::~QList(&local_170);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                KDReports::Report::mainTable();
                KDReports::MainTable::pageRects();
                pQVar6 = QList<QRect>::operator[](&local_198,1);
                QRect::QRect(&local_1a8,1,0,1,8);
                bVar2 = QTest::qCompare<QRect,QRect>
                                  (pQVar6,&local_1a8,"report.mainTable()->pageRects()[1]",
                                   "QRect(1, 0, 1, 8)",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0xd3);
                QList<QRect>::~QList(&local_198);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  KDReports::Report::mainTable();
                  KDReports::MainTable::pageRects();
                  pQVar6 = QList<QRect>::operator[](&local_1c0,2);
                  QRect::QRect(&local_1d0,2,0,1,8);
                  bVar2 = QTest::qCompare<QRect,QRect>
                                    (pQVar6,&local_1d0,"report.mainTable()->pageRects()[2]",
                                     "QRect(2, 0, 1, 8)",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0xd4);
                  QList<QRect>::~QList(&local_1c0);
                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                    KDReports::Report::mainTable();
                    KDReports::MainTable::pageRects();
                    pQVar6 = QList<QRect>::operator[](&local_1e8,3);
                    QRect::QRect(&local_1f8,3,0,1,8);
                    bVar2 = QTest::qCompare<QRect,QRect>
                                      (pQVar6,&local_1f8,"report.mainTable()->pageRects()[3]",
                                       "QRect(3, 0, 1, 8)",
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                       ,0xd5);
                    QList<QRect>::~QList(&local_1e8);
                    if (((bVar2 ^ 0xffU) & 1) == 0) {
                      local_f4 = 0;
                    }
                    else {
                      local_f4 = 1;
                    }
                  }
                  else {
                    local_f4 = 1;
                  }
                }
                else {
                  local_f4 = 1;
                }
              }
              else {
                local_f4 = 1;
              }
            }
            else {
              local_f4 = 1;
            }
          }
        }
        else {
          local_f4 = 1;
        }
      }
      else {
        local_f4 = 1;
      }
    }
    KDReports::Report::~Report(local_98);
  }
  else {
    QString::QString(&local_58,"Font %1 not found");
    QString::QString(&local_70,"Noto Sans");
    QLatin1Char::QLatin1Char(&local_7f,' ');
    QChar::QChar(local_7e,local_7f);
    QString::arg(&local_40,(int)&local_58,(QChar *)&local_70);
    QString::toLatin1(&local_28,&local_40);
    pcVar4 = QByteArray::operator_cast_to_char_(&local_28);
    QTest::qSkip(pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0xc4);
    QByteArray::~QByteArray(&local_28);
    QString::~QString(&local_40);
    QString::~QString(&local_70);
    QString::~QString(&local_58);
  }
  return;
}

Assistant:

void testSimpleScaleTo()
    {
        SKIP_IF_FONT_NOT_FOUND

        fillModel(4, 8);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 14));
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(1, 4);
        QCOMPARE(report.numberOfPages(), 1); // it fits
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 1.0);
        QCOMPARE(report.mainTable()->pageRects(), QList<QRect>() << QRect(0, 0, 4, 8));
        report.scaleTo(4, 1);
        QCOMPARE(report.numberOfPages(), 4); // one column per page
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 1.0);
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 1, 8));
        QCOMPARE(report.mainTable()->pageRects()[1], QRect(1, 0, 1, 8));
        QCOMPARE(report.mainTable()->pageRects()[2], QRect(2, 0, 1, 8));
        QCOMPARE(report.mainTable()->pageRects()[3], QRect(3, 0, 1, 8));
    }